

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

string * __thiscall
helics::CommonCore::getDestinationTargets_abi_cxx11_(CommonCore *this,InterfaceHandle handle)

{
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  *p_Var1;
  FederateState *pFVar2;
  PublicationInfo *pPVar3;
  string *psVar4;
  EndpointInfo *pEVar5;
  undefined4 in_ESI;
  undefined8 in_RDI;
  EndpointInfo *eptInfo;
  FederateState *fed_1;
  PublicationInfo *pubInfo;
  FederateState *fed;
  _Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
  *handleInfo;
  CommonCore *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined8 in_stack_ffffffffffffffc0;
  InterfaceHandle handle_00;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 in_stack_ffffffffffffffd0;
  LocalFederateId federateID;
  undefined4 in_stack_fffffffffffffff0;
  undefined1 *local_8;
  
  handle_00.hid = (BaseType)((ulong)in_stack_ffffffffffffffc0 >> 0x20);
  federateID.fid = (BaseType)((ulong)in_stack_ffffffffffffffd0 >> 0x20);
  p_Var1 = getHandleInfo(in_stack_ffffffffffffff88,
                         (InterfaceHandle)(BaseType)((ulong)in_RDI >> 0x20));
  if (p_Var1 != (_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                 *)0x0) {
    switch((p_Var1->
           super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>
           ._M_storage._M_storage.__data[4]) {
    case 'e':
      pFVar2 = getFederateAt((CommonCore *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             federateID);
      FederateState::interfaces(pFVar2);
      pEVar5 = InterfaceInfo::getEndpoint
                         ((InterfaceInfo *)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),handle_00);
      if (pEVar5 != (EndpointInfo *)0x0) {
        psVar4 = EndpointInfo::getDestinationTargets_abi_cxx11_
                           ((EndpointInfo *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
        return psVar4;
      }
      break;
    case 'f':
    default:
      local_8 = gEmptyString_abi_cxx11_;
      return (string *)local_8;
    case 'i':
      local_8 = gEmptyString_abi_cxx11_;
      return (string *)local_8;
    case 'p':
      pFVar2 = getFederateAt((CommonCore *)
                             CONCAT44(*(undefined4 *)
                                       &(p_Var1->
                                        super__Hash_node_value<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>,_true>
                                        ).
                                        super__Hash_node_value_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_helics::DataType>_>
                                        ._M_storage._M_storage,in_stack_ffffffffffffffc8),federateID
                            );
      FederateState::interfaces(pFVar2);
      pPVar3 = InterfaceInfo::getPublication
                         ((InterfaceInfo *)CONCAT44(in_ESI,in_stack_ffffffffffffffb8),handle_00);
      if (pPVar3 != (PublicationInfo *)0x0) {
        psVar4 = PublicationInfo::getTargets_abi_cxx11_
                           ((PublicationInfo *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
        return psVar4;
      }
    }
  }
  local_8 = gEmptyString_abi_cxx11_;
  return (string *)local_8;
}

Assistant:

const std::string& CommonCore::getDestinationTargets(InterfaceHandle handle) const
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo != nullptr) {
        switch (handleInfo->handleType) {
            case InterfaceType::INPUT:
                return gEmptyString;
            case InterfaceType::PUBLICATION: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* pubInfo = fed->interfaces().getPublication(handle);
                if (pubInfo != nullptr) {
                    return pubInfo->getTargets();
                }
                break;
            }
            case InterfaceType::ENDPOINT: {
                auto* fed = getFederateAt(handleInfo->local_fed_id);
                auto* eptInfo = fed->interfaces().getEndpoint(handle);
                if (eptInfo != nullptr) {
                    return eptInfo->getDestinationTargets();
                }
                break;
            }
            case InterfaceType::FILTER:
            default:
                return gEmptyString;
        }
    }
    return gEmptyString;
}